

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  ulong uVar1;
  RTCRayQueryContext *pRVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  size_t k;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  ulong uVar39;
  bool bVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  ulong *puVar46;
  long lVar47;
  uint uVar48;
  undefined4 uVar49;
  ulong unaff_R12;
  NodeRef root;
  undefined1 (*pauVar50) [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [36];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  uint uVar98;
  uint uVar99;
  uint uVar103;
  uint uVar104;
  uint uVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5f99;
  long local_5f98;
  RTCFilterFunctionNArguments local_5f90;
  undefined1 local_5f60 [32];
  Geometry *local_5f38;
  RayK<8> *local_5f30;
  undefined4 local_5f24;
  undefined1 local_5f20 [32];
  undefined1 (*local_5ee8) [32];
  undefined1 local_5ee0 [32];
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [8];
  undefined1 auStack_5e78 [8];
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  float fStack_5e64;
  undefined1 local_5e60 [32];
  Intersectors *local_5e28;
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [8];
  undefined1 auStack_5db8 [8];
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  undefined8 local_5d90;
  undefined8 uStack_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [8];
  float fStack_5d38;
  float fStack_5d34;
  float fStack_5d30;
  float fStack_5d2c;
  float fStack_5d28;
  float fStack_5d24;
  undefined1 local_5d20 [32];
  float local_5d00;
  float fStack_5cfc;
  float fStack_5cf8;
  float fStack_5cf4;
  float fStack_5cf0;
  float fStack_5cec;
  float fStack_5ce8;
  float fStack_5ce4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5ce0;
  RTCRayQueryContext local_5cc0 [4];
  RTCRayN local_5ca0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c80;
  undefined1 local_5c20 [8];
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  undefined4 uStack_5c04;
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [32];
  uint local_5ba0;
  uint uStack_5b9c;
  uint uStack_5b98;
  uint uStack_5b94;
  uint uStack_5b90;
  uint uStack_5b8c;
  uint uStack_5b88;
  uint uStack_5b84;
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  undefined1 local_5b60 [32];
  int local_5b40 [8];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b20;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5b00;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined1 local_5aa0 [32];
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  local_5808 = (bvh->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar65 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar55 = ZEXT816(0) << 0x40;
      auVar69 = vpcmpeqd_avx2(auVar65,(undefined1  [32])valid_i->field_0);
      auVar65 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar55),5);
      auVar56 = auVar69 & auVar65;
      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0x7f,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar56 >> 0xbf,0) != '\0') ||
          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar56[0x1f] < '\0') {
        auVar65 = vandps_avx(auVar65,auVar69);
        local_5a40._0_4_ = *(float *)ray;
        local_5a40._4_4_ = *(float *)(ray + 4);
        local_5a40._8_4_ = *(float *)(ray + 8);
        local_5a40._12_4_ = *(float *)(ray + 0xc);
        local_5a40._16_4_ = *(float *)(ray + 0x10);
        local_5a40._20_4_ = *(float *)(ray + 0x14);
        local_5a40._24_4_ = *(float *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(float *)(ray + 0x20);
        local_5a40._36_4_ = *(float *)(ray + 0x24);
        local_5a40._40_4_ = *(float *)(ray + 0x28);
        local_5a40._44_4_ = *(float *)(ray + 0x2c);
        local_5a40._48_4_ = *(float *)(ray + 0x30);
        local_5a40._52_4_ = *(float *)(ray + 0x34);
        local_5a40._56_4_ = *(float *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(float *)(ray + 0x40);
        local_5a40._68_4_ = *(float *)(ray + 0x44);
        local_5a40._72_4_ = *(float *)(ray + 0x48);
        local_5a40._76_4_ = *(float *)(ray + 0x4c);
        local_5a40._80_4_ = *(float *)(ray + 0x50);
        local_5a40._84_4_ = *(float *)(ray + 0x54);
        local_5a40._88_4_ = *(float *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5b60._8_4_ = 0x7fffffff;
        local_5b60._0_8_ = 0x7fffffff7fffffff;
        local_5b60._12_4_ = 0x7fffffff;
        local_5b60._16_4_ = 0x7fffffff;
        local_5b60._20_4_ = 0x7fffffff;
        local_5b60._24_4_ = 0x7fffffff;
        local_5b60._28_4_ = 0x7fffffff;
        auVar100._8_4_ = 0x219392ef;
        auVar100._0_8_ = 0x219392ef219392ef;
        auVar100._12_4_ = 0x219392ef;
        auVar100._16_4_ = 0x219392ef;
        auVar100._20_4_ = 0x219392ef;
        auVar100._24_4_ = 0x219392ef;
        auVar100._28_4_ = 0x219392ef;
        auVar56 = vandps_avx(local_5b60,local_59e0);
        auVar56 = vcmpps_avx(auVar56,auVar100,1);
        auVar69 = vblendvps_avx(local_59e0,auVar100,auVar56);
        auVar56 = vandps_avx(local_5b60,local_59c0);
        auVar56 = vcmpps_avx(auVar56,auVar100,1);
        auVar70 = vblendvps_avx(local_59c0,auVar100,auVar56);
        auVar56 = vandps_avx(local_59a0,local_5b60);
        auVar56 = vcmpps_avx(auVar56,auVar100,1);
        auVar56 = vblendvps_avx(local_59a0,auVar100,auVar56);
        auVar4 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
        auVar66 = ZEXT1664(auVar4);
        auVar65 = vrcpps_avx(auVar69);
        auVar101._8_4_ = 0x3f800000;
        auVar101._0_8_ = 0x3f8000003f800000;
        auVar101._12_4_ = 0x3f800000;
        auVar101._16_4_ = 0x3f800000;
        auVar101._20_4_ = 0x3f800000;
        auVar101._24_4_ = 0x3f800000;
        auVar101._28_4_ = 0x3f800000;
        auVar12 = vfnmadd213ps_fma(auVar69,auVar65,auVar101);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar65,auVar65);
        auVar65 = vrcpps_avx(auVar70);
        auVar13 = vfnmadd213ps_fma(auVar70,auVar65,auVar101);
        auVar69 = vrcpps_avx(auVar56);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar65,auVar65);
        auVar14 = vfnmadd213ps_fma(auVar56,auVar69,auVar101);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar69,auVar69);
        local_5980 = ZEXT1632(auVar12);
        local_5960 = ZEXT1632(auVar13);
        local_5940 = ZEXT1632(auVar14);
        local_5920 = auVar12._0_4_ * *(float *)ray;
        fStack_591c = auVar12._4_4_ * *(float *)(ray + 4);
        fStack_5918 = auVar12._8_4_ * *(float *)(ray + 8);
        fStack_5914 = auVar12._12_4_ * *(float *)(ray + 0xc);
        fStack_5910 = *(float *)(ray + 0x10) * 0.0;
        fStack_590c = *(float *)(ray + 0x14) * 0.0;
        fStack_5908 = *(float *)(ray + 0x18) * 0.0;
        uStack_5904 = *(undefined4 *)(ray + 0x1c);
        local_5900 = *(float *)(ray + 0x20) * auVar13._0_4_;
        fStack_58fc = *(float *)(ray + 0x24) * auVar13._4_4_;
        fStack_58f8 = *(float *)(ray + 0x28) * auVar13._8_4_;
        fStack_58f4 = *(float *)(ray + 0x2c) * auVar13._12_4_;
        fStack_58f0 = *(float *)(ray + 0x30) * 0.0;
        fStack_58ec = *(float *)(ray + 0x34) * 0.0;
        fStack_58e8 = *(float *)(ray + 0x38) * 0.0;
        uStack_58e4 = *(undefined4 *)(ray + 0x3c);
        local_58e0 = *(float *)(ray + 0x40) * auVar14._0_4_;
        fStack_58dc = *(float *)(ray + 0x44) * auVar14._4_4_;
        fStack_58d8 = *(float *)(ray + 0x48) * auVar14._8_4_;
        fStack_58d4 = *(float *)(ray + 0x4c) * auVar14._12_4_;
        fStack_58d0 = *(float *)(ray + 0x50) * 0.0;
        fStack_58cc = *(float *)(ray + 0x54) * 0.0;
        fStack_58c8 = *(float *)(ray + 0x58) * 0.0;
        uStack_58c4 = *(undefined4 *)(ray + 0x5c);
        auVar65 = vcmpps_avx(ZEXT1632(auVar12),ZEXT1632(auVar55),1);
        auVar69._8_4_ = 0x20;
        auVar69._0_8_ = 0x2000000020;
        auVar69._12_4_ = 0x20;
        auVar69._16_4_ = 0x20;
        auVar69._20_4_ = 0x20;
        auVar69._24_4_ = 0x20;
        auVar69._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar65,auVar69);
        auVar56 = ZEXT1632(auVar55);
        auVar65 = vcmpps_avx(ZEXT1632(auVar13),auVar56,5);
        auVar70._8_4_ = 0x40;
        auVar70._0_8_ = 0x4000000040;
        auVar70._12_4_ = 0x40;
        auVar70._16_4_ = 0x40;
        auVar70._20_4_ = 0x40;
        auVar70._24_4_ = 0x40;
        auVar70._28_4_ = 0x40;
        auVar76._8_4_ = 0x60;
        auVar76._0_8_ = 0x6000000060;
        auVar76._12_4_ = 0x60;
        auVar76._16_4_ = 0x60;
        auVar76._20_4_ = 0x60;
        auVar76._24_4_ = 0x60;
        auVar76._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar76,auVar70,auVar65);
        auVar65 = vcmpps_avx(ZEXT1632(auVar14),auVar56,5);
        auVar71._8_4_ = 0x80;
        auVar71._0_8_ = 0x8000000080;
        auVar71._12_4_ = 0x80;
        auVar71._16_4_ = 0x80;
        auVar71._20_4_ = 0x80;
        auVar71._24_4_ = 0x80;
        auVar71._28_4_ = 0x80;
        auVar77._8_4_ = 0xa0;
        auVar77._0_8_ = 0xa0000000a0;
        auVar77._12_4_ = 0xa0;
        auVar77._16_4_ = 0xa0;
        auVar77._20_4_ = 0xa0;
        auVar77._24_4_ = 0xa0;
        auVar77._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar77,auVar71,auVar65);
        auVar65 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar56);
        local_5aa0 = vpmovsxwd_avx2(auVar4);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar97 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar65,local_5aa0);
        auVar65 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar56);
        auVar56._8_4_ = 0xff800000;
        auVar56._0_8_ = 0xff800000ff800000;
        auVar56._12_4_ = 0xff800000;
        auVar56._16_4_ = 0xff800000;
        auVar56._20_4_ = 0xff800000;
        auVar56._24_4_ = 0xff800000;
        auVar56._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar56,auVar65,local_5aa0);
        auVar55 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5de0 = vpmovsxwd_avx2(auVar4 ^ auVar55);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar48 = 7;
        }
        else {
          uVar48 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f30 = ray + 0x100;
        puVar46 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar50 = (undefined1 (*) [32])local_4640;
        local_5ac0 = mm_lookupmask_ps._16_8_;
        uStack_5ab8 = mm_lookupmask_ps._24_8_;
        uStack_5ab0 = mm_lookupmask_ps._16_8_;
        uStack_5aa8 = mm_lookupmask_ps._24_8_;
        local_4660 = local_5860;
        local_5ae0 = mm_lookupmask_pd._0_8_;
        uStack_5ad8 = mm_lookupmask_pd._8_8_;
        uStack_5ad0 = mm_lookupmask_pd._0_8_;
        uStack_5ac8 = mm_lookupmask_pd._8_8_;
        local_5ee8 = (undefined1 (*) [32])&local_5ba0;
        local_5e28 = This;
LAB_016a20b1:
        do {
          do {
            root.ptr = puVar46[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_016a319c;
            puVar46 = puVar46 + -1;
            pauVar50 = pauVar50 + -1;
            local_5f60 = *pauVar50;
            auVar65 = vcmpps_avx(local_5f60,local_5840,1);
          } while ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar65 >> 0x7f,0) == '\0') &&
                     (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar65 >> 0xbf,0) == '\0') &&
                   (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar65[0x1f]);
          uVar49 = vmovmskps_avx(auVar65);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar49);
          if (uVar48 < (uint)POPCOUNT(uVar49)) {
LAB_016a20ef:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_016a319c;
                auVar65 = vcmpps_avx(local_5840,local_5f60,6);
                if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar65 >> 0x7f,0) == '\0') &&
                      (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar65 >> 0xbf,0) == '\0') &&
                    (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar65[0x1f]) goto LAB_016a20b1;
                lVar43 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                local_5d80 = auVar65 ^ local_5de0;
                lVar42 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar45 = 0;
                goto LAB_016a22d6;
              }
              uVar44 = 8;
              local_5f60 = auVar97._0_32_;
              for (lVar42 = 0;
                  (lVar42 != 8 &&
                  (uVar1 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar42 * 8), uVar1 != 8));
                  lVar42 = lVar42 + 1) {
                uVar49 = *(undefined4 *)(root.ptr + 0x40 + lVar42 * 4);
                auVar57._4_4_ = uVar49;
                auVar57._0_4_ = uVar49;
                auVar57._8_4_ = uVar49;
                auVar57._12_4_ = uVar49;
                auVar57._16_4_ = uVar49;
                auVar57._20_4_ = uVar49;
                auVar57._24_4_ = uVar49;
                auVar57._28_4_ = uVar49;
                auVar36._4_4_ = fStack_591c;
                auVar36._0_4_ = local_5920;
                auVar36._8_4_ = fStack_5918;
                auVar36._12_4_ = fStack_5914;
                auVar36._16_4_ = fStack_5910;
                auVar36._20_4_ = fStack_590c;
                auVar36._24_4_ = fStack_5908;
                auVar36._28_4_ = uStack_5904;
                uVar49 = *(undefined4 *)(root.ptr + 0x80 + lVar42 * 4);
                auVar78._4_4_ = uVar49;
                auVar78._0_4_ = uVar49;
                auVar78._8_4_ = uVar49;
                auVar78._12_4_ = uVar49;
                auVar78._16_4_ = uVar49;
                auVar78._20_4_ = uVar49;
                auVar78._24_4_ = uVar49;
                auVar78._28_4_ = uVar49;
                auVar55 = vfmsub213ps_fma(auVar57,local_5980,auVar36);
                auVar37._4_4_ = fStack_58fc;
                auVar37._0_4_ = local_5900;
                auVar37._8_4_ = fStack_58f8;
                auVar37._12_4_ = fStack_58f4;
                auVar37._16_4_ = fStack_58f0;
                auVar37._20_4_ = fStack_58ec;
                auVar37._24_4_ = fStack_58e8;
                auVar37._28_4_ = uStack_58e4;
                uVar49 = *(undefined4 *)(root.ptr + 0xc0 + lVar42 * 4);
                auVar86._4_4_ = uVar49;
                auVar86._0_4_ = uVar49;
                auVar86._8_4_ = uVar49;
                auVar86._12_4_ = uVar49;
                auVar86._16_4_ = uVar49;
                auVar86._20_4_ = uVar49;
                auVar86._24_4_ = uVar49;
                auVar86._28_4_ = uVar49;
                auVar4 = vfmsub213ps_fma(auVar78,local_5960,auVar37);
                auVar38._4_4_ = fStack_58dc;
                auVar38._0_4_ = local_58e0;
                auVar38._8_4_ = fStack_58d8;
                auVar38._12_4_ = fStack_58d4;
                auVar38._16_4_ = fStack_58d0;
                auVar38._20_4_ = fStack_58cc;
                auVar38._24_4_ = fStack_58c8;
                auVar38._28_4_ = uStack_58c4;
                uVar49 = *(undefined4 *)(root.ptr + 0x60 + lVar42 * 4);
                auVar95._4_4_ = uVar49;
                auVar95._0_4_ = uVar49;
                auVar95._8_4_ = uVar49;
                auVar95._12_4_ = uVar49;
                auVar95._16_4_ = uVar49;
                auVar95._20_4_ = uVar49;
                auVar95._24_4_ = uVar49;
                auVar95._28_4_ = uVar49;
                auVar12 = vfmsub213ps_fma(auVar86,local_5940,auVar38);
                auVar13 = vfmsub213ps_fma(auVar95,local_5980,auVar36);
                uVar49 = *(undefined4 *)(root.ptr + 0xa0 + lVar42 * 4);
                auVar72._4_4_ = uVar49;
                auVar72._0_4_ = uVar49;
                auVar72._8_4_ = uVar49;
                auVar72._12_4_ = uVar49;
                auVar72._16_4_ = uVar49;
                auVar72._20_4_ = uVar49;
                auVar72._24_4_ = uVar49;
                auVar72._28_4_ = uVar49;
                auVar14 = vfmsub213ps_fma(auVar72,local_5960,auVar37);
                uVar49 = *(undefined4 *)(root.ptr + 0xe0 + lVar42 * 4);
                auVar62._4_4_ = uVar49;
                auVar62._0_4_ = uVar49;
                auVar62._8_4_ = uVar49;
                auVar62._12_4_ = uVar49;
                auVar62._16_4_ = uVar49;
                auVar62._20_4_ = uVar49;
                auVar62._24_4_ = uVar49;
                auVar62._28_4_ = uVar49;
                auVar9 = vfmsub213ps_fma(auVar62,local_5940,auVar38);
                auVar65 = vpminsd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar13));
                auVar56 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
                auVar65 = vpmaxsd_avx2(auVar65,auVar56);
                auVar56 = vpminsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar9));
                auVar69 = vpmaxsd_avx2(auVar65,auVar56);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar13));
                auVar56 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar14));
                auVar56 = vpminsd_avx2(auVar65,auVar56);
                auVar65 = vpmaxsd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar9));
                auVar56 = vpminsd_avx2(auVar56,auVar65);
                auVar65 = vpmaxsd_avx2(auVar69,local_5860);
                auVar66 = ZEXT3264(auVar65);
                auVar56 = vpminsd_avx2(auVar56,local_5840);
                auVar56 = vcmpps_avx(auVar65,auVar56,2);
                uVar39 = uVar44;
                auVar65 = local_5f60;
                if (((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar56 >> 0x7f,0) != '\0') ||
                       (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar56 >> 0xbf,0) != '\0') ||
                     (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar56[0x1f] < '\0') &&
                   (auVar65 = vblendvps_avx(auVar97._0_32_,auVar69,auVar56), uVar39 = uVar1,
                   uVar44 != 8)) {
                  *puVar46 = uVar44;
                  puVar46 = puVar46 + 1;
                  *pauVar50 = local_5f60;
                  pauVar50 = pauVar50 + 1;
                }
                local_5f60 = auVar65;
                uVar44 = uVar39;
              }
              if (uVar44 == 8) goto LAB_016a226f;
              auVar65 = vcmpps_avx(local_5840,local_5f60,6);
              uVar49 = vmovmskps_avx(auVar65);
              root.ptr = uVar44;
            } while ((byte)uVar48 < (byte)POPCOUNT(uVar49));
            *puVar46 = uVar44;
            puVar46 = puVar46 + 1;
            *pauVar50 = local_5f60;
            pauVar50 = pauVar50 + 1;
LAB_016a226f:
            iVar41 = 4;
          }
          else {
            while (unaff_R12 != 0) {
              k = 0;
              for (uVar44 = unaff_R12; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              unaff_R12 = unaff_R12 - 1 & unaff_R12;
              local_5f20._0_8_ = k;
              auVar66 = ZEXT1664(auVar66._0_16_);
              bVar40 = occluded1(local_5e28,bvh,root,k,&local_5f99,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar40) {
                *(undefined4 *)(local_5de0 + local_5f20._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar65 = _DAT_01f7b020 & ~local_5de0;
            iVar41 = 3;
            auVar97 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar65 >> 0x7f,0) != '\0') ||
                  (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0xbf,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar65[0x1f] < '\0') {
              auVar65._8_4_ = 0xff800000;
              auVar65._0_8_ = 0xff800000ff800000;
              auVar65._12_4_ = 0xff800000;
              auVar65._16_4_ = 0xff800000;
              auVar65._20_4_ = 0xff800000;
              auVar65._24_4_ = 0xff800000;
              auVar65._28_4_ = 0xff800000;
              auVar66 = ZEXT3264(auVar65);
              local_5840 = vblendvps_avx(local_5840,auVar65,local_5de0);
              iVar41 = 2;
            }
            unaff_R12 = 0;
            if (uVar48 < (uint)POPCOUNT(uVar49)) goto LAB_016a20ef;
          }
        } while (iVar41 != 3);
LAB_016a319c:
        auVar65 = vandps_avx(local_5aa0,local_5de0);
        auVar61._8_4_ = 0xff800000;
        auVar61._0_8_ = 0xff800000ff800000;
        auVar61._12_4_ = 0xff800000;
        auVar61._16_4_ = 0xff800000;
        auVar61._20_4_ = 0xff800000;
        auVar61._24_4_ = 0xff800000;
        auVar61._28_4_ = 0xff800000;
        auVar65 = vmaskmovps_avx(auVar65,auVar61);
        *(undefined1 (*) [32])local_5f30 = auVar65;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_016a22d6:
  do {
    auVar65 = auVar66._0_32_;
    if (lVar45 == lVar43) break;
    lVar47 = lVar45 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar56 = local_5d80;
    for (unaff_R12 = 0; unaff_R12 != 4; unaff_R12 = unaff_R12 + 1) {
      uVar44 = CONCAT44(0,*(uint *)(lVar42 + unaff_R12 * 4));
      local_5d60._0_8_ = uVar44;
      if (uVar44 == 0xffffffff) break;
      fVar106 = *(float *)(lVar42 + -0xc0 + unaff_R12 * 4);
      auVar73._4_4_ = fVar106;
      auVar73._0_4_ = fVar106;
      auVar73._8_4_ = fVar106;
      auVar73._12_4_ = fVar106;
      auVar73._16_4_ = fVar106;
      auVar73._20_4_ = fVar106;
      auVar73._24_4_ = fVar106;
      auVar73._28_4_ = fVar106;
      fVar107 = *(float *)(lVar42 + -0xb0 + unaff_R12 * 4);
      auVar87._4_4_ = fVar107;
      auVar87._0_4_ = fVar107;
      auVar87._8_4_ = fVar107;
      auVar87._12_4_ = fVar107;
      auVar87._16_4_ = fVar107;
      auVar87._20_4_ = fVar107;
      auVar87._24_4_ = fVar107;
      auVar87._28_4_ = fVar107;
      fVar108 = *(float *)(lVar42 + -0xa0 + unaff_R12 * 4);
      auVar92._4_4_ = fVar108;
      auVar92._0_4_ = fVar108;
      auVar92._8_4_ = fVar108;
      auVar92._12_4_ = fVar108;
      auVar92._16_4_ = fVar108;
      auVar92._20_4_ = fVar108;
      auVar92._24_4_ = fVar108;
      auVar92._28_4_ = fVar108;
      local_5e80._4_4_ = *(float *)(lVar42 + -0x90 + unaff_R12 * 4);
      local_5dc0._4_4_ = *(float *)(lVar42 + -0x80 + unaff_R12 * 4);
      local_5d40._4_4_ = *(float *)(lVar42 + -0x70 + unaff_R12 * 4);
      local_5f60._4_4_ = *(undefined4 *)(lVar42 + -0x60 + unaff_R12 * 4);
      local_5f60._0_4_ = local_5f60._4_4_;
      local_5f60._8_4_ = local_5f60._4_4_;
      local_5f60._12_4_ = local_5f60._4_4_;
      local_5f60._16_4_ = local_5f60._4_4_;
      local_5f60._20_4_ = local_5f60._4_4_;
      local_5f60._24_4_ = local_5f60._4_4_;
      local_5f60._28_4_ = local_5f60._4_4_;
      local_5e00._4_4_ = *(undefined4 *)(lVar42 + -0x50 + unaff_R12 * 4);
      local_5e00._0_4_ = local_5e00._4_4_;
      local_5e00._8_4_ = local_5e00._4_4_;
      local_5e00._12_4_ = local_5e00._4_4_;
      local_5e00._16_4_ = local_5e00._4_4_;
      local_5e00._20_4_ = local_5e00._4_4_;
      local_5e00._24_4_ = local_5e00._4_4_;
      local_5e00._28_4_ = local_5e00._4_4_;
      local_5d20._4_4_ = *(undefined4 *)(lVar42 + -0x40 + unaff_R12 * 4);
      local_5d20._0_4_ = local_5d20._4_4_;
      local_5d20._8_4_ = local_5d20._4_4_;
      local_5d20._12_4_ = local_5d20._4_4_;
      local_5d20._16_4_ = local_5d20._4_4_;
      local_5d20._20_4_ = local_5d20._4_4_;
      local_5d20._24_4_ = local_5d20._4_4_;
      local_5d20._28_4_ = local_5d20._4_4_;
      local_5d00 = *(float *)(lVar42 + -0x30 + unaff_R12 * 4);
      local_5a60 = *(float *)(lVar42 + -0x20 + unaff_R12 * 4);
      local_5a80 = *(float *)(lVar42 + -0x10 + unaff_R12 * 4);
      local_5d90 = *(undefined8 *)(lVar47 + 0xd0);
      uStack_5d88 = *(undefined8 *)(lVar47 + 0xd8);
      local_5e80._0_4_ = local_5e80._4_4_;
      auStack_5e78._0_4_ = local_5e80._4_4_;
      auStack_5e78._4_4_ = local_5e80._4_4_;
      fStack_5e70 = (float)local_5e80._4_4_;
      fStack_5e6c = (float)local_5e80._4_4_;
      fStack_5e68 = (float)local_5e80._4_4_;
      fStack_5e64 = (float)local_5e80._4_4_;
      fVar81 = fVar106 - (float)local_5e80._4_4_;
      local_5d40._0_4_ = local_5d40._4_4_;
      fStack_5d38 = (float)local_5d40._4_4_;
      fStack_5d34 = (float)local_5d40._4_4_;
      fStack_5d30 = (float)local_5d40._4_4_;
      fStack_5d2c = (float)local_5d40._4_4_;
      fStack_5d28 = (float)local_5d40._4_4_;
      fStack_5d24 = (float)local_5d40._4_4_;
      fVar82 = fVar108 - (float)local_5d40._4_4_;
      local_5ea0._4_4_ = fVar82;
      local_5ea0._0_4_ = fVar82;
      local_5ea0._8_4_ = fVar82;
      local_5ea0._12_4_ = fVar82;
      local_5ea0._16_4_ = fVar82;
      local_5ea0._20_4_ = fVar82;
      local_5ea0._24_4_ = fVar82;
      local_5ea0._28_4_ = fVar82;
      fStack_5cfc = local_5d00;
      fStack_5cf8 = local_5d00;
      fStack_5cf4 = local_5d00;
      fStack_5cf0 = local_5d00;
      fStack_5cec = local_5d00;
      fStack_5ce8 = local_5d00;
      fStack_5ce4 = local_5d00;
      fVar106 = local_5d00 - fVar106;
      fVar75 = fVar82 * fVar106;
      auVar102._4_4_ = fVar106;
      auVar102._0_4_ = fVar106;
      auVar102._8_4_ = fVar106;
      auVar102._12_4_ = fVar106;
      auVar102._16_4_ = fVar106;
      auVar102._20_4_ = fVar106;
      auVar102._24_4_ = fVar106;
      auVar102._28_4_ = fVar106;
      local_5ec0._4_4_ = fVar81;
      local_5ec0._0_4_ = fVar81;
      local_5ec0._8_4_ = fVar81;
      local_5ec0._12_4_ = fVar81;
      local_5ec0._16_4_ = fVar81;
      local_5ec0._20_4_ = fVar81;
      local_5ec0._24_4_ = fVar81;
      local_5ec0._28_4_ = fVar81;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      fVar83 = local_5a60 - fVar107;
      fVar106 = fVar81 * fVar83;
      auVar109._4_4_ = fVar83;
      auVar109._0_4_ = fVar83;
      auVar109._8_4_ = fVar83;
      auVar109._12_4_ = fVar83;
      auVar109._16_4_ = fVar83;
      auVar109._20_4_ = fVar83;
      auVar109._24_4_ = fVar83;
      auVar109._28_4_ = fVar83;
      local_5dc0._0_4_ = local_5dc0._4_4_;
      auStack_5db8._0_4_ = local_5dc0._4_4_;
      auStack_5db8._4_4_ = local_5dc0._4_4_;
      fStack_5db0 = (float)local_5dc0._4_4_;
      fStack_5dac = (float)local_5dc0._4_4_;
      fStack_5da8 = (float)local_5dc0._4_4_;
      fStack_5da4 = (float)local_5dc0._4_4_;
      fVar107 = fVar107 - (float)local_5dc0._4_4_;
      auVar96._4_4_ = fVar107;
      auVar96._0_4_ = fVar107;
      auVar96._8_4_ = fVar107;
      auVar96._12_4_ = fVar107;
      auVar96._16_4_ = fVar107;
      auVar96._20_4_ = fVar107;
      auVar96._24_4_ = fVar107;
      auVar96._28_4_ = fVar107;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fVar83 = local_5a80 - fVar108;
      fVar107 = fVar107 * fVar83;
      auVar110._4_4_ = fVar83;
      auVar110._0_4_ = fVar83;
      auVar110._8_4_ = fVar83;
      auVar110._12_4_ = fVar83;
      auVar110._16_4_ = fVar83;
      auVar110._20_4_ = fVar83;
      auVar110._24_4_ = fVar83;
      auVar110._28_4_ = fVar83;
      auVar51._4_4_ = fVar107;
      auVar51._0_4_ = fVar107;
      auVar51._8_4_ = fVar107;
      auVar51._12_4_ = fVar107;
      auVar51._16_4_ = fVar107;
      auVar51._20_4_ = fVar107;
      auVar51._24_4_ = fVar107;
      auVar51._28_4_ = fVar107;
      auVar12 = vfmsub231ps_fma(auVar51,auVar109,local_5ea0);
      auVar58._4_4_ = fVar75;
      auVar58._0_4_ = fVar75;
      auVar58._8_4_ = fVar75;
      auVar58._12_4_ = fVar75;
      auVar58._16_4_ = fVar75;
      auVar58._20_4_ = fVar75;
      auVar58._24_4_ = fVar75;
      auVar58._28_4_ = fVar75;
      auVar13 = vfmsub231ps_fma(auVar58,auVar110,local_5ec0);
      auVar63._4_4_ = fVar106;
      auVar63._0_4_ = fVar106;
      auVar63._8_4_ = fVar106;
      auVar63._12_4_ = fVar106;
      auVar63._16_4_ = fVar106;
      auVar63._20_4_ = fVar106;
      auVar63._24_4_ = fVar106;
      auVar63._28_4_ = fVar106;
      auVar71 = vsubps_avx(auVar73,*(undefined1 (*) [32])ray);
      auVar76 = vsubps_avx(auVar87,*(undefined1 (*) [32])(ray + 0x20));
      uVar99 = auVar76._28_4_;
      auVar14 = vfmsub231ps_fma(auVar63,auVar102,auVar96);
      auVar77 = vsubps_avx(auVar92,*(undefined1 (*) [32])(ray + 0x40));
      auVar65 = *(undefined1 (*) [32])(ray + 0x80);
      auVar69 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar5._4_4_ = auVar65._4_4_ * auVar76._4_4_;
      auVar5._0_4_ = auVar65._0_4_ * auVar76._0_4_;
      auVar5._8_4_ = auVar65._8_4_ * auVar76._8_4_;
      auVar5._12_4_ = auVar65._12_4_ * auVar76._12_4_;
      auVar5._16_4_ = auVar65._16_4_ * auVar76._16_4_;
      auVar5._20_4_ = auVar65._20_4_ * auVar76._20_4_;
      auVar5._24_4_ = auVar65._24_4_ * auVar76._24_4_;
      auVar5._28_4_ = fVar82;
      auVar9 = vfmsub231ps_fma(auVar5,auVar71,auVar69);
      auVar70 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar6._4_4_ = auVar14._4_4_ * auVar70._4_4_;
      auVar6._0_4_ = auVar14._0_4_ * auVar70._0_4_;
      auVar6._8_4_ = auVar14._8_4_ * auVar70._8_4_;
      auVar6._12_4_ = auVar14._12_4_ * auVar70._12_4_;
      auVar6._16_4_ = auVar70._16_4_ * 0.0;
      auVar6._20_4_ = auVar70._20_4_ * 0.0;
      auVar6._24_4_ = auVar70._24_4_ * 0.0;
      auVar6._28_4_ = fVar108;
      auVar55 = vfmadd231ps_fma(auVar6,ZEXT1632(auVar13),auVar69);
      auVar7._4_4_ = auVar77._4_4_ * auVar69._4_4_;
      auVar7._0_4_ = auVar77._0_4_ * auVar69._0_4_;
      auVar7._8_4_ = auVar77._8_4_ * auVar69._8_4_;
      auVar7._12_4_ = auVar77._12_4_ * auVar69._12_4_;
      auVar7._16_4_ = auVar77._16_4_ * auVar69._16_4_;
      auVar7._20_4_ = auVar77._20_4_ * auVar69._20_4_;
      auVar7._24_4_ = auVar77._24_4_ * auVar69._24_4_;
      auVar7._28_4_ = fVar81;
      auVar10 = vfmsub231ps_fma(auVar7,auVar76,auVar70);
      auVar8._4_4_ = auVar70._4_4_ * auVar71._4_4_;
      auVar8._0_4_ = auVar70._0_4_ * auVar71._0_4_;
      auVar8._8_4_ = auVar70._8_4_ * auVar71._8_4_;
      auVar8._12_4_ = auVar70._12_4_ * auVar71._12_4_;
      auVar8._16_4_ = auVar70._16_4_ * auVar71._16_4_;
      auVar8._20_4_ = auVar70._20_4_ * auVar71._20_4_;
      auVar8._24_4_ = auVar70._24_4_ * auVar71._24_4_;
      auVar8._28_4_ = auVar69._28_4_;
      auVar11 = vfmsub231ps_fma(auVar8,auVar77,auVar65);
      auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),ZEXT1632(auVar12),auVar65);
      auVar15._4_4_ = fVar83 * auVar9._4_4_;
      auVar15._0_4_ = fVar83 * auVar9._0_4_;
      auVar15._8_4_ = fVar83 * auVar9._8_4_;
      auVar15._12_4_ = fVar83 * auVar9._12_4_;
      auVar15._16_4_ = fVar83 * 0.0;
      auVar15._20_4_ = fVar83 * 0.0;
      auVar15._24_4_ = fVar83 * 0.0;
      auVar15._28_4_ = auVar65._28_4_;
      auVar66 = ZEXT3264(auVar56);
      auVar4 = vfmadd231ps_fma(auVar15,ZEXT1632(auVar11),auVar109);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar10),auVar102);
      auVar79._8_4_ = 0x80000000;
      auVar79._0_8_ = 0x8000000080000000;
      auVar79._12_4_ = 0x80000000;
      auVar79._16_4_ = 0x80000000;
      auVar79._20_4_ = 0x80000000;
      auVar79._24_4_ = 0x80000000;
      auVar79._28_4_ = 0x80000000;
      auVar65 = vandps_avx(ZEXT1632(auVar55),auVar79);
      uVar98 = auVar65._0_4_;
      auVar74._0_4_ = (float)(uVar98 ^ auVar4._0_4_);
      uVar103 = auVar65._4_4_;
      auVar74._4_4_ = (float)(uVar103 ^ auVar4._4_4_);
      uVar104 = auVar65._8_4_;
      auVar74._8_4_ = (float)(uVar104 ^ auVar4._8_4_);
      uVar105 = auVar65._12_4_;
      auVar74._12_4_ = (float)(uVar105 ^ auVar4._12_4_);
      fVar106 = auVar65._16_4_;
      auVar74._16_4_ = fVar106;
      fVar107 = auVar65._20_4_;
      auVar74._20_4_ = fVar107;
      fVar108 = auVar65._24_4_;
      auVar74._24_4_ = fVar108;
      uVar49 = auVar65._28_4_;
      auVar74._28_4_ = uVar49;
      auVar65 = vcmpps_avx(auVar74,_DAT_01f7b000,5);
      auVar69 = auVar56 & auVar65;
      local_5f20 = auVar56;
      auVar91 = ZEXT436(uVar99);
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar69 >> 0x7f,0) != '\0') ||
            (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar69 >> 0xbf,0) != '\0') ||
          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar69[0x1f] < '\0') {
        auVar65 = vandps_avx(auVar65,auVar56);
        auVar22._4_4_ = auVar9._4_4_ * fVar82;
        auVar22._0_4_ = auVar9._0_4_ * fVar82;
        auVar22._8_4_ = auVar9._8_4_ * fVar82;
        auVar22._12_4_ = auVar9._12_4_ * fVar82;
        auVar22._16_4_ = fVar82 * 0.0;
        auVar22._20_4_ = fVar82 * 0.0;
        auVar22._24_4_ = fVar82 * 0.0;
        auVar22._28_4_ = 0x80000000;
        auVar4 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar11),auVar22);
        auVar4 = vfmadd213ps_fma(local_5ec0,ZEXT1632(auVar10),ZEXT1632(auVar4));
        auVar68._0_4_ = (float)(uVar98 ^ auVar4._0_4_);
        auVar68._4_4_ = (float)(uVar103 ^ auVar4._4_4_);
        auVar68._8_4_ = (float)(uVar104 ^ auVar4._8_4_);
        auVar68._12_4_ = (float)(uVar105 ^ auVar4._12_4_);
        auVar68._16_4_ = fVar106;
        auVar68._20_4_ = fVar107;
        auVar68._24_4_ = fVar108;
        auVar68._28_4_ = uVar49;
        auVar69 = vcmpps_avx(auVar68,_DAT_01f7b000,5);
        auVar70 = auVar65 & auVar69;
        local_5e20 = auVar79;
        auVar91 = ZEXT436(uVar99);
        if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar70 >> 0x7f,0) != '\0') ||
              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0xbf,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar70[0x1f] < '\0') {
          auVar70 = vandps_avx(ZEXT1632(auVar55),local_5b60);
          auVar65 = vandps_avx(auVar69,auVar65);
          auVar69 = vsubps_avx(auVar70,auVar74);
          auVar69 = vcmpps_avx(auVar69,auVar68,5);
          auVar100 = auVar65 & auVar69;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar100 >> 0x7f,0) != '\0') ||
                (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0xbf,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0x1f] < '\0') {
            local_5ec0._0_8_ = lVar45;
            local_5ea0._0_8_ = lVar43;
            auVar65 = vandps_avx(auVar69,auVar65);
            auVar25._4_4_ = auVar77._4_4_ * auVar14._4_4_;
            auVar25._0_4_ = auVar77._0_4_ * auVar14._0_4_;
            auVar25._8_4_ = auVar77._8_4_ * auVar14._8_4_;
            auVar25._12_4_ = auVar77._12_4_ * auVar14._12_4_;
            auVar25._16_4_ = auVar77._16_4_ * 0.0;
            auVar25._20_4_ = auVar77._20_4_ * 0.0;
            auVar25._24_4_ = auVar77._24_4_ * 0.0;
            auVar25._28_4_ = auVar77._28_4_;
            auVar4 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar13),auVar25);
            auVar4 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar12),ZEXT1632(auVar4));
            auVar85._0_4_ = (float)(uVar98 ^ auVar4._0_4_);
            auVar85._4_4_ = (float)(uVar103 ^ auVar4._4_4_);
            auVar85._8_4_ = (float)(uVar104 ^ auVar4._8_4_);
            auVar85._12_4_ = (float)(uVar105 ^ auVar4._12_4_);
            auVar85._16_4_ = fVar106;
            auVar85._20_4_ = fVar107;
            auVar85._24_4_ = fVar108;
            auVar85._28_4_ = uVar49;
            auVar89._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x60);
            auVar89._4_4_ = auVar70._4_4_ * *(float *)(ray + 100);
            auVar89._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x68);
            auVar89._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x6c);
            auVar89._16_4_ = auVar70._16_4_ * *(float *)(ray + 0x70);
            auVar89._20_4_ = auVar70._20_4_ * *(float *)(ray + 0x74);
            auVar89._24_4_ = auVar70._24_4_ * *(float *)(ray + 0x78);
            auVar89._28_4_ = 0;
            auVar26._4_4_ = auVar70._4_4_ * *(float *)(ray + 0x104);
            auVar26._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x100);
            auVar26._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x108);
            auVar26._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x10c);
            auVar26._16_4_ = auVar70._16_4_ * *(float *)(ray + 0x110);
            auVar26._20_4_ = auVar70._20_4_ * *(float *)(ray + 0x114);
            auVar26._24_4_ = auVar70._24_4_ * *(float *)(ray + 0x118);
            auVar26._28_4_ = auVar77._28_4_;
            auVar69 = vcmpps_avx(auVar89,auVar85,1);
            auVar71 = vcmpps_avx(auVar85,auVar26,2);
            auVar69 = vandps_avx(auVar71,auVar69);
            auVar91 = ZEXT436(auVar69._28_4_);
            auVar71 = auVar65 & auVar69;
            local_5f98 = lVar47;
            if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar71 >> 0x7f,0) != '\0') ||
                  (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar71 >> 0xbf,0) != '\0') ||
                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar71[0x1f] < '\0') {
              auVar65 = vandps_avx(auVar65,auVar69);
              auVar91 = ZEXT436(auVar65._28_4_);
              auVar69 = vcmpps_avx(ZEXT1632(auVar55),_DAT_01f7b000,4);
              auVar71 = auVar65 & auVar69;
              if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar71 >> 0x7f,0) != '\0') ||
                    (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar71 >> 0xbf,0) != '\0') ||
                  (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar71[0x1f] < '\0') {
                auVar65 = vandps_avx(auVar69,auVar65);
                auVar91 = ZEXT436(auVar65._28_4_);
                local_5f38 = (context->scene->geometries).items[uVar44].ptr;
                uVar99 = local_5f38->mask;
                auVar93._4_4_ = uVar99;
                auVar93._0_4_ = uVar99;
                auVar93._8_4_ = uVar99;
                auVar93._12_4_ = uVar99;
                auVar93._16_4_ = uVar99;
                auVar93._20_4_ = uVar99;
                auVar93._24_4_ = uVar99;
                auVar93._28_4_ = uVar99;
                auVar69 = vpand_avx2(auVar93,*(undefined1 (*) [32])(ray + 0x120));
                auVar71 = vpcmpeqd_avx2(auVar69,_DAT_01f7b000);
                auVar69 = auVar65 & ~auVar71;
                if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar69 >> 0x7f,0) != '\0') ||
                      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar69 >> 0xbf,0) != '\0') ||
                    (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar69[0x1f] < '\0') {
                  local_5f24 = *(undefined4 *)((long)&local_5d90 + unaff_R12 * 4);
                  local_5ee0 = vandnps_avx(auVar71,auVar65);
                  auVar91 = ZEXT436(local_5ee0._28_4_);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_5f38->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar65 = vrcpps_avx(auVar70);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = 0x3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar94._16_4_ = 0x3f800000;
                    auVar94._20_4_ = 0x3f800000;
                    auVar94._24_4_ = 0x3f800000;
                    auVar94._28_4_ = 0x3f800000;
                    auVar55 = vfnmadd213ps_fma(auVar70,auVar65,auVar94);
                    auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar65,auVar65);
                    fVar75 = auVar55._0_4_;
                    fVar81 = auVar55._4_4_;
                    local_5c20._4_4_ = fVar81 * auVar85._4_4_;
                    local_5c20._0_4_ = fVar75 * auVar85._0_4_;
                    fVar82 = auVar55._8_4_;
                    fStack_5c18 = fVar82 * auVar85._8_4_;
                    fVar83 = auVar55._12_4_;
                    fStack_5c14 = fVar83 * auVar85._12_4_;
                    fStack_5c10 = fVar106 * 0.0;
                    fStack_5c0c = fVar107 * 0.0;
                    fStack_5c08 = fVar108 * 0.0;
                    uStack_5c04 = uVar49;
                    auVar29._4_4_ = fVar81 * auVar74._4_4_;
                    auVar29._0_4_ = fVar75 * auVar74._0_4_;
                    auVar29._8_4_ = fVar82 * auVar74._8_4_;
                    auVar29._12_4_ = fVar83 * auVar74._12_4_;
                    auVar29._16_4_ = fVar106 * 0.0;
                    auVar29._20_4_ = fVar107 * 0.0;
                    auVar29._24_4_ = fVar108 * 0.0;
                    auVar29._28_4_ = uVar49;
                    auVar65 = vminps_avx(auVar29,auVar94);
                    auVar30._4_4_ = fVar81 * auVar68._4_4_;
                    auVar30._0_4_ = fVar75 * auVar68._0_4_;
                    auVar30._8_4_ = fVar82 * auVar68._8_4_;
                    auVar30._12_4_ = fVar83 * auVar68._12_4_;
                    auVar30._16_4_ = fVar106 * 0.0;
                    auVar30._20_4_ = fVar107 * 0.0;
                    auVar30._24_4_ = fVar108 * 0.0;
                    auVar30._28_4_ = uVar49;
                    auVar56 = vminps_avx(auVar30,auVar94);
                    auVar69 = vsubps_avx(auVar94,auVar65);
                    auVar70 = vsubps_avx(auVar94,auVar56);
                    auVar33._8_8_ = uStack_5ab8;
                    auVar33._0_8_ = local_5ac0;
                    auVar33._16_8_ = uStack_5ab0;
                    auVar33._24_8_ = uStack_5aa8;
                    _local_5be0 = vblendvps_avx(auVar65,auVar69,auVar33);
                    local_5c00 = vblendvps_avx(auVar56,auVar70,auVar33);
                    local_5c80.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar12);
                    local_5c80.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar13);
                    local_5f90.valid = local_5b40;
                    local_5f90.geometryUserPtr = &local_5ce0;
                    local_5f90.context = local_5cc0;
                    local_5f90.ray = local_5ca0;
                    auVar91 = (undefined1  [36])0x0;
                    local_5c80.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar14);
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                    ::
                    _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                *)&local_5f90,
                               (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                *)&local_5c80.field_0);
                    pRVar2 = context->user;
                    local_5bc0._4_4_ = local_5d60._0_4_;
                    local_5bc0._0_4_ = local_5d60._0_4_;
                    local_5bc0._8_4_ = local_5d60._0_4_;
                    local_5bc0._12_4_ = local_5d60._0_4_;
                    local_5bc0._16_4_ = local_5d60._0_4_;
                    local_5bc0._20_4_ = local_5d60._0_4_;
                    local_5bc0._24_4_ = local_5d60._0_4_;
                    local_5bc0._28_4_ = local_5d60._0_4_;
                    local_5c80.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b20;
                    local_5c80.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b00;
                    local_5be0._4_4_ = local_5f24;
                    local_5be0._0_4_ = local_5f24;
                    fStack_5bd8 = (float)local_5f24;
                    fStack_5bd4 = (float)local_5f24;
                    fStack_5bd0 = (float)local_5f24;
                    fStack_5bcc = (float)local_5f24;
                    fStack_5bc8 = (float)local_5f24;
                    fStack_5bc4 = (float)local_5f24;
                    auVar65 = vpcmpeqd_avx2(local_5bc0,local_5bc0);
                    local_5ee8[1] = auVar65;
                    *local_5ee8 = auVar65;
                    local_5ba0 = pRVar2->instID[0];
                    uStack_5b9c = local_5ba0;
                    uStack_5b98 = local_5ba0;
                    uStack_5b94 = local_5ba0;
                    uStack_5b90 = local_5ba0;
                    uStack_5b8c = local_5ba0;
                    uStack_5b88 = local_5ba0;
                    uStack_5b84 = local_5ba0;
                    local_5b80 = pRVar2->instPrimID[0];
                    uStack_5b7c = local_5b80;
                    uStack_5b78 = local_5b80;
                    uStack_5b74 = local_5b80;
                    uStack_5b70 = local_5b80;
                    uStack_5b6c = local_5b80;
                    uStack_5b68 = local_5b80;
                    uStack_5b64 = local_5b80;
                    local_5d60 = *(undefined1 (*) [32])(ray + 0x100);
                    auVar65 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),
                                            (undefined1  [32])local_5ce0,local_5ee0);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar65;
                    local_5e60 = local_5ee0;
                    local_5f90.valid = (int *)local_5e60;
                    local_5f90.geometryUserPtr = local_5f38->userPtr;
                    local_5f90.context = context->user;
                    local_5f90.hit = (RTCHitN *)&local_5c80;
                    local_5f90.N = 8;
                    local_5f90.ray = (RTCRayN *)ray;
                    if (local_5f38->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar91 = (undefined1  [36])0x0;
                      (*local_5f38->occlusionFilterN)(&local_5f90);
                    }
                    auVar56 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                    auVar65 = _DAT_01f7b020 & ~auVar56;
                    if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar65 >> 0x7f,0) == '\0') &&
                          (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar65 >> 0xbf,0) == '\0') &&
                        (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar65[0x1f]) {
                      local_5ee0._0_8_ = auVar56._0_8_ ^ 0xffffffffffffffff;
                      local_5ee0._8_4_ = auVar56._8_4_ ^ 0xffffffff;
                      local_5ee0._12_4_ = auVar56._12_4_ ^ 0xffffffff;
                      local_5ee0._16_4_ = auVar56._16_4_ ^ 0xffffffff;
                      local_5ee0._20_4_ = auVar56._20_4_ ^ 0xffffffff;
                      local_5ee0._24_4_ = auVar56._24_4_ ^ 0xffffffff;
                      local_5ee0._28_4_ = auVar56._28_4_ ^ 0xffffffff;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_5f38->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar91 = (undefined1  [36])0x0;
                        local_5ee0 = local_5e60;
                        (*p_Var3)(&local_5f90);
                      }
                      auVar65 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
                      local_5ee0 = auVar65 ^ _DAT_01f7b020;
                      auVar60._8_4_ = 0xff800000;
                      auVar60._0_8_ = 0xff800000ff800000;
                      auVar60._12_4_ = 0xff800000;
                      auVar60._16_4_ = 0xff800000;
                      auVar60._20_4_ = 0xff800000;
                      auVar60._24_4_ = 0xff800000;
                      auVar60._28_4_ = 0xff800000;
                      auVar65 = vblendvps_avx(auVar60,*(undefined1 (*) [32])(local_5f90.ray + 0x100)
                                              ,auVar65);
                      *(undefined1 (*) [32])(local_5f90.ray + 0x100) = auVar65;
                    }
                    auVar65 = vblendvps_avx(local_5d60,*(undefined1 (*) [32])local_5f30,local_5ee0);
                    *(undefined1 (*) [32])local_5f30 = auVar65;
                  }
                  auVar65 = vandnps_avx(local_5ee0,local_5f20);
                  auVar66 = ZEXT3264(auVar65);
                  lVar43 = local_5ea0._0_8_;
                  lVar45 = local_5ec0._0_8_;
                  lVar47 = local_5f98;
                  auVar79 = local_5e20;
                  goto LAB_016a24e1;
                }
              }
            }
            auVar66 = ZEXT3264(auVar56);
          }
        }
      }
LAB_016a24e1:
      auVar56 = auVar66._0_32_;
      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar56 >> 0x7f,0) == '\0') &&
            (auVar66 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar56 >> 0xbf,0) == '\0') &&
          (auVar66 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) && -1 < auVar66[0x1f])
      {
        auVar97 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        break;
      }
      auVar31._4_4_ = fStack_5cfc;
      auVar31._0_4_ = local_5d00;
      auVar31._8_4_ = fStack_5cf8;
      auVar31._12_4_ = fStack_5cf4;
      auVar31._16_4_ = fStack_5cf0;
      auVar31._20_4_ = fStack_5cec;
      auVar31._24_4_ = fStack_5ce8;
      auVar31._28_4_ = fStack_5ce4;
      auVar71 = vsubps_avx(local_5f60,auVar31);
      auVar35._4_4_ = fStack_5a5c;
      auVar35._0_4_ = local_5a60;
      auVar35._8_4_ = fStack_5a58;
      auVar35._12_4_ = fStack_5a54;
      auVar35._16_4_ = fStack_5a50;
      auVar35._20_4_ = fStack_5a4c;
      auVar35._24_4_ = fStack_5a48;
      auVar35._28_4_ = fStack_5a44;
      auVar76 = vsubps_avx(local_5e00,auVar35);
      auVar34._4_4_ = fStack_5a7c;
      auVar34._0_4_ = local_5a80;
      auVar34._8_4_ = fStack_5a78;
      auVar34._12_4_ = fStack_5a74;
      auVar34._16_4_ = fStack_5a70;
      auVar34._20_4_ = fStack_5a6c;
      auVar34._24_4_ = fStack_5a68;
      auVar34._28_4_ = fStack_5a64;
      auVar77 = vsubps_avx(local_5d20,auVar34);
      auVar100 = vsubps_avx(_local_5e80,local_5f60);
      auVar101 = vsubps_avx(_local_5dc0,local_5e00);
      auVar5 = vsubps_avx((undefined1  [32])_local_5d40,local_5d20);
      auVar16._4_4_ = auVar76._4_4_ * auVar5._4_4_;
      auVar16._0_4_ = auVar76._0_4_ * auVar5._0_4_;
      auVar16._8_4_ = auVar76._8_4_ * auVar5._8_4_;
      auVar16._12_4_ = auVar76._12_4_ * auVar5._12_4_;
      auVar16._16_4_ = auVar76._16_4_ * auVar5._16_4_;
      auVar16._20_4_ = auVar76._20_4_ * auVar5._20_4_;
      auVar16._24_4_ = auVar76._24_4_ * auVar5._24_4_;
      auVar16._28_4_ = local_5d40._28_4_;
      auVar12 = vfmsub231ps_fma(auVar16,auVar101,auVar77);
      auVar97._0_4_ = auVar77._0_4_ * auVar100._0_4_;
      auVar97._4_4_ = auVar77._4_4_ * auVar100._4_4_;
      auVar97._8_4_ = auVar77._8_4_ * auVar100._8_4_;
      auVar97._12_4_ = auVar77._12_4_ * auVar100._12_4_;
      auVar97._16_4_ = auVar77._16_4_ * auVar100._16_4_;
      auVar97._20_4_ = auVar77._20_4_ * auVar100._20_4_;
      auVar97._24_4_ = auVar77._24_4_ * auVar100._24_4_;
      auVar97._28_36_ = auVar91;
      auVar13 = vfmsub231ps_fma(auVar97._0_32_,auVar5,auVar71);
      auVar17._4_4_ = auVar101._4_4_ * auVar71._4_4_;
      auVar17._0_4_ = auVar101._0_4_ * auVar71._0_4_;
      auVar17._8_4_ = auVar101._8_4_ * auVar71._8_4_;
      auVar17._12_4_ = auVar101._12_4_ * auVar71._12_4_;
      auVar17._16_4_ = auVar101._16_4_ * auVar71._16_4_;
      auVar17._20_4_ = auVar101._20_4_ * auVar71._20_4_;
      auVar17._24_4_ = auVar101._24_4_ * auVar71._24_4_;
      auVar17._28_4_ = auVar71._28_4_;
      auVar6 = vsubps_avx(local_5f60,*(undefined1 (*) [32])ray);
      auVar7 = vsubps_avx(local_5e00,*(undefined1 (*) [32])(ray + 0x20));
      auVar8 = vsubps_avx(local_5d20,*(undefined1 (*) [32])(ray + 0x40));
      auVar14 = vfmsub231ps_fma(auVar17,auVar100,auVar76);
      auVar65 = *(undefined1 (*) [32])(ray + 0x80);
      auVar69 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar111._0_4_ = auVar7._0_4_ * auVar65._0_4_;
      auVar111._4_4_ = auVar7._4_4_ * auVar65._4_4_;
      auVar111._8_4_ = auVar7._8_4_ * auVar65._8_4_;
      auVar111._12_4_ = auVar7._12_4_ * auVar65._12_4_;
      auVar111._16_4_ = auVar7._16_4_ * auVar65._16_4_;
      auVar111._20_4_ = auVar7._20_4_ * auVar65._20_4_;
      auVar111._28_36_ = auVar66._28_36_;
      auVar111._24_4_ = auVar7._24_4_ * auVar65._24_4_;
      auVar9 = vfmsub231ps_fma(auVar111._0_32_,auVar6,auVar69);
      auVar70 = *(undefined1 (*) [32])(ray + 0xc0);
      _local_5d40 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar14);
      auVar18._4_4_ = auVar70._4_4_ * auVar14._4_4_;
      auVar18._0_4_ = auVar70._0_4_ * auVar14._0_4_;
      auVar18._8_4_ = auVar70._8_4_ * auVar14._8_4_;
      auVar18._12_4_ = auVar70._12_4_ * auVar14._12_4_;
      auVar18._16_4_ = auVar70._16_4_ * 0.0;
      auVar18._20_4_ = auVar70._20_4_ * 0.0;
      auVar18._24_4_ = auVar70._24_4_ * 0.0;
      auVar18._28_4_ = local_5d20._28_4_;
      local_5d20 = ZEXT1632(auVar13);
      auVar55 = vfmadd231ps_fma(auVar18,local_5d20,auVar69);
      auVar19._4_4_ = auVar69._4_4_ * auVar8._4_4_;
      auVar19._0_4_ = auVar69._0_4_ * auVar8._0_4_;
      auVar19._8_4_ = auVar69._8_4_ * auVar8._8_4_;
      auVar19._12_4_ = auVar69._12_4_ * auVar8._12_4_;
      auVar19._16_4_ = auVar69._16_4_ * auVar8._16_4_;
      auVar19._20_4_ = auVar69._20_4_ * auVar8._20_4_;
      auVar19._24_4_ = auVar69._24_4_ * auVar8._24_4_;
      auVar19._28_4_ = auVar69._28_4_;
      auVar10 = vfmsub231ps_fma(auVar19,auVar7,auVar70);
      auVar20._4_4_ = auVar70._4_4_ * auVar6._4_4_;
      auVar20._0_4_ = auVar70._0_4_ * auVar6._0_4_;
      auVar20._8_4_ = auVar70._8_4_ * auVar6._8_4_;
      auVar20._12_4_ = auVar70._12_4_ * auVar6._12_4_;
      auVar20._16_4_ = auVar70._16_4_ * auVar6._16_4_;
      auVar20._20_4_ = auVar70._20_4_ * auVar6._20_4_;
      auVar20._24_4_ = auVar70._24_4_ * auVar6._24_4_;
      auVar20._28_4_ = auVar70._28_4_;
      auVar11 = vfmsub231ps_fma(auVar20,auVar8,auVar65);
      local_5e00 = ZEXT1632(auVar12);
      auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),local_5e00,auVar65);
      auVar21._4_4_ = auVar5._4_4_ * auVar9._4_4_;
      auVar21._0_4_ = auVar5._0_4_ * auVar9._0_4_;
      auVar21._8_4_ = auVar5._8_4_ * auVar9._8_4_;
      auVar21._12_4_ = auVar5._12_4_ * auVar9._12_4_;
      auVar21._16_4_ = auVar5._16_4_ * 0.0;
      auVar21._20_4_ = auVar5._20_4_ * 0.0;
      auVar21._24_4_ = auVar5._24_4_ * 0.0;
      auVar21._28_4_ = auVar65._28_4_;
      auVar4 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar11),auVar101);
      auVar65 = vandps_avx(ZEXT1632(auVar55),auVar79);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar10),auVar100);
      uVar99 = auVar65._0_4_;
      auVar67._0_4_ = (float)(uVar99 ^ auVar4._0_4_);
      uVar98 = auVar65._4_4_;
      auVar67._4_4_ = (float)(uVar98 ^ auVar4._4_4_);
      uVar103 = auVar65._8_4_;
      auVar67._8_4_ = (float)(uVar103 ^ auVar4._8_4_);
      uVar104 = auVar65._12_4_;
      auVar67._12_4_ = (float)(uVar104 ^ auVar4._12_4_);
      fVar106 = auVar65._16_4_;
      auVar67._16_4_ = fVar106;
      fVar107 = auVar65._20_4_;
      auVar67._20_4_ = fVar107;
      fVar108 = auVar65._24_4_;
      auVar67._24_4_ = fVar108;
      uVar49 = auVar65._28_4_;
      auVar67._28_4_ = uVar49;
      auVar65 = vcmpps_avx(auVar67,_DAT_01f7b000,5);
      auVar69 = auVar56 & auVar65;
      _local_5e80 = auVar71;
      _local_5dc0 = auVar77;
      local_5f20 = auVar56;
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar69 >> 0x7f,0) == '\0') &&
            (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar69 >> 0xbf,0) == '\0') &&
          (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
      {
LAB_016a2620:
        auVar97 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar65 = vandps_avx(auVar65,auVar56);
        auVar52._0_4_ = auVar9._0_4_ * auVar77._0_4_;
        auVar52._4_4_ = auVar9._4_4_ * auVar77._4_4_;
        auVar52._8_4_ = auVar9._8_4_ * auVar77._8_4_;
        auVar52._12_4_ = auVar9._12_4_ * auVar77._12_4_;
        auVar52._16_4_ = auVar77._16_4_ * 0.0;
        auVar52._20_4_ = auVar77._20_4_ * 0.0;
        auVar52._24_4_ = auVar77._24_4_ * 0.0;
        auVar52._28_4_ = 0;
        auVar4 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar11),auVar52);
        auVar4 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar10),ZEXT1632(auVar4));
        auVar84._0_4_ = (float)(uVar99 ^ auVar4._0_4_);
        auVar84._4_4_ = (float)(uVar98 ^ auVar4._4_4_);
        auVar84._8_4_ = (float)(uVar103 ^ auVar4._8_4_);
        auVar84._12_4_ = (float)(uVar104 ^ auVar4._12_4_);
        auVar84._16_4_ = fVar106;
        auVar84._20_4_ = fVar107;
        auVar84._24_4_ = fVar108;
        auVar84._28_4_ = uVar49;
        auVar69 = vcmpps_avx(auVar84,_DAT_01f7b000,5);
        auVar70 = auVar65 & auVar69;
        if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar70 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar70 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar70 >> 0x7f,0) == '\0') &&
              (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar70 >> 0xbf,0) == '\0') &&
            (auVar70 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar70[0x1f]) goto LAB_016a2620;
        auVar70 = vandps_avx(ZEXT1632(auVar55),local_5b60);
        auVar65 = vandps_avx(auVar69,auVar65);
        auVar76 = vsubps_avx(auVar70,auVar67);
        auVar69 = vcmpps_avx(auVar76,auVar84,5);
        auVar100 = auVar65 & auVar69;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) goto LAB_016a2620;
        auVar65 = vandps_avx(auVar69,auVar65);
        auVar23._4_4_ = auVar8._4_4_ * auVar14._4_4_;
        auVar23._0_4_ = auVar8._0_4_ * auVar14._0_4_;
        auVar23._8_4_ = auVar8._8_4_ * auVar14._8_4_;
        auVar23._12_4_ = auVar8._12_4_ * auVar14._12_4_;
        auVar23._16_4_ = auVar8._16_4_ * 0.0;
        auVar23._20_4_ = auVar8._20_4_ * 0.0;
        auVar23._24_4_ = auVar8._24_4_ * 0.0;
        auVar23._28_4_ = auVar76._28_4_;
        auVar4 = vfmadd132ps_fma(auVar7,auVar23,local_5d20);
        auVar4 = vfmadd132ps_fma(auVar6,ZEXT1632(auVar4),local_5e00);
        auVar80._0_4_ = (float)(uVar99 ^ auVar4._0_4_);
        auVar80._4_4_ = (float)(uVar98 ^ auVar4._4_4_);
        auVar80._8_4_ = (float)(uVar103 ^ auVar4._8_4_);
        auVar80._12_4_ = (float)(uVar104 ^ auVar4._12_4_);
        auVar80._16_4_ = fVar106;
        auVar80._20_4_ = fVar107;
        auVar80._24_4_ = fVar108;
        auVar80._28_4_ = uVar49;
        auVar24._4_4_ = auVar70._4_4_ * *(float *)(ray + 100);
        auVar24._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x60);
        auVar24._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x68);
        auVar24._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x6c);
        auVar24._16_4_ = auVar70._16_4_ * *(float *)(ray + 0x70);
        auVar24._20_4_ = auVar70._20_4_ * *(float *)(ray + 0x74);
        auVar24._24_4_ = auVar70._24_4_ * *(float *)(ray + 0x78);
        auVar24._28_4_ = auVar76._28_4_;
        auVar88._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x100);
        auVar88._4_4_ = auVar70._4_4_ * *(float *)(ray + 0x104);
        auVar88._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x108);
        auVar88._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x10c);
        auVar88._16_4_ = auVar70._16_4_ * *(float *)(ray + 0x110);
        auVar88._20_4_ = auVar70._20_4_ * *(float *)(ray + 0x114);
        auVar88._24_4_ = auVar70._24_4_ * *(float *)(ray + 0x118);
        auVar88._28_4_ = 0;
        auVar69 = vcmpps_avx(auVar24,auVar80,1);
        auVar76 = vcmpps_avx(auVar80,auVar88,2);
        auVar69 = vandps_avx(auVar76,auVar69);
        auVar76 = auVar65 & auVar69;
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0x7f,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar76 >> 0xbf,0) == '\0') &&
            (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar76[0x1f]) goto LAB_016a2620;
        auVar65 = vandps_avx(auVar65,auVar69);
        auVar69 = vcmpps_avx(ZEXT1632(auVar55),_DAT_01f7b000,4);
        auVar76 = auVar65 & auVar69;
        if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar76 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar76 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar76 >> 0x7f,0) == '\0') &&
              (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar76 >> 0xbf,0) == '\0') &&
            (auVar76 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar76[0x1f]) goto LAB_016a2620;
        auVar65 = vandps_avx(auVar69,auVar65);
        local_5dc0 = (undefined1  [8])CONCAT44(0,*(uint *)(lVar42 + unaff_R12 * 4));
        _auStack_5db8 = auVar77._8_24_;
        local_5e80 = (undefined1  [8])(context->scene->geometries).items[(long)local_5dc0].ptr;
        _auStack_5e78 = auVar71._8_24_;
        uVar99 = ((Geometry *)local_5e80)->mask;
        auVar53._4_4_ = uVar99;
        auVar53._0_4_ = uVar99;
        auVar53._8_4_ = uVar99;
        auVar53._12_4_ = uVar99;
        auVar53._16_4_ = uVar99;
        auVar53._20_4_ = uVar99;
        auVar53._24_4_ = uVar99;
        auVar53._28_4_ = uVar99;
        auVar69 = vpand_avx2(auVar53,*(undefined1 (*) [32])(ray + 0x120));
        auVar71 = vpcmpeqd_avx2(auVar69,_DAT_01f7b000);
        auVar69 = auVar65 & ~auVar71;
        if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar69 >> 0x7f,0) == '\0') &&
              (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar69 >> 0xbf,0) == '\0') &&
            (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar69[0x1f]) goto LAB_016a2620;
        local_5ec0._0_8_ = lVar45;
        local_5ea0._0_8_ = lVar43;
        local_5d00 = *(float *)((long)&local_5d90 + unaff_R12 * 4);
        local_5f60 = vandnps_avx(auVar71,auVar65);
        local_5f98 = lVar47;
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (((Geometry *)local_5e80)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar69 = vrcpps_avx(auVar70);
          auVar90._8_4_ = 0x3f800000;
          auVar90._0_8_ = 0x3f8000003f800000;
          auVar90._12_4_ = 0x3f800000;
          auVar90._16_4_ = 0x3f800000;
          auVar90._20_4_ = 0x3f800000;
          auVar90._24_4_ = 0x3f800000;
          auVar90._28_4_ = 0x3f800000;
          auVar55 = vfnmadd213ps_fma(auVar70,auVar69,auVar90);
          auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar69,auVar69);
          fVar75 = auVar55._0_4_;
          fVar81 = auVar55._4_4_;
          fVar82 = auVar55._8_4_;
          fVar83 = auVar55._12_4_;
          auVar27._4_4_ = fVar81 * auVar67._4_4_;
          auVar27._0_4_ = fVar75 * auVar67._0_4_;
          auVar27._8_4_ = fVar82 * auVar67._8_4_;
          auVar27._12_4_ = fVar83 * auVar67._12_4_;
          auVar27._16_4_ = fVar106 * 0.0;
          auVar27._20_4_ = fVar107 * 0.0;
          auVar27._24_4_ = fVar108 * 0.0;
          auVar27._28_4_ = uVar49;
          auVar65 = vminps_avx(auVar27,auVar90);
          auVar28._4_4_ = fVar81 * auVar84._4_4_;
          auVar28._0_4_ = fVar75 * auVar84._0_4_;
          auVar28._8_4_ = fVar82 * auVar84._8_4_;
          auVar28._12_4_ = fVar83 * auVar84._12_4_;
          auVar28._16_4_ = fVar106 * 0.0;
          auVar28._20_4_ = fVar107 * 0.0;
          auVar28._24_4_ = fVar108 * 0.0;
          auVar28._28_4_ = auVar8._28_4_;
          auVar56 = vminps_avx(auVar28,auVar90);
          auVar70 = vsubps_avx(auVar90,auVar65);
          auVar71 = vsubps_avx(auVar90,auVar56);
          auVar32._8_8_ = uStack_5ad8;
          auVar32._0_8_ = local_5ae0;
          auVar32._16_8_ = uStack_5ad0;
          auVar32._24_8_ = uStack_5ac8;
          _local_5be0 = vblendvps_avx(auVar65,auVar70,auVar32);
          local_5c00 = vblendvps_avx(auVar56,auVar71,auVar32);
          local_5c80.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar12);
          local_5c80.field_0.y.field_0 = (vfloat_impl<8>)ZEXT1632(auVar13);
          local_5c20._4_4_ = fVar81 * auVar80._4_4_;
          local_5c20._0_4_ = fVar75 * auVar80._0_4_;
          fStack_5c18 = fVar82 * auVar80._8_4_;
          fStack_5c14 = fVar83 * auVar80._12_4_;
          fStack_5c10 = fVar106 * 0.0;
          fStack_5c0c = fVar107 * 0.0;
          fStack_5c08 = fVar108 * 0.0;
          uStack_5c04 = auVar69._28_4_;
          local_5f90.valid = local_5b40;
          local_5f90.geometryUserPtr = &local_5ce0;
          local_5f90.context = local_5cc0;
          local_5f90.ray = local_5ca0;
          local_5c80._64_32_ = ZEXT1632(auVar14);
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_5f90,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_5c80.field_0);
          pRVar2 = context->user;
          local_5bc0._4_4_ = local_5dc0._0_4_;
          local_5bc0._0_4_ = local_5dc0._0_4_;
          local_5bc0._8_4_ = local_5dc0._0_4_;
          local_5bc0._12_4_ = local_5dc0._0_4_;
          local_5bc0._16_4_ = local_5dc0._0_4_;
          local_5bc0._20_4_ = local_5dc0._0_4_;
          local_5bc0._24_4_ = local_5dc0._0_4_;
          local_5bc0._28_4_ = local_5dc0._0_4_;
          local_5c80.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b20;
          local_5c80.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_5b00;
          local_5be0._4_4_ = local_5d00;
          local_5be0._0_4_ = local_5d00;
          fStack_5bd8 = local_5d00;
          fStack_5bd4 = local_5d00;
          fStack_5bd0 = local_5d00;
          fStack_5bcc = local_5d00;
          fStack_5bc8 = local_5d00;
          fStack_5bc4 = local_5d00;
          auVar65 = vpcmpeqd_avx2(local_5bc0,local_5bc0);
          local_5ee8[1] = auVar65;
          *local_5ee8 = auVar65;
          local_5ba0 = pRVar2->instID[0];
          uStack_5b9c = local_5ba0;
          uStack_5b98 = local_5ba0;
          uStack_5b94 = local_5ba0;
          uStack_5b90 = local_5ba0;
          uStack_5b8c = local_5ba0;
          uStack_5b88 = local_5ba0;
          uStack_5b84 = local_5ba0;
          local_5b80 = pRVar2->instPrimID[0];
          uStack_5b7c = local_5b80;
          uStack_5b78 = local_5b80;
          uStack_5b74 = local_5b80;
          uStack_5b70 = local_5b80;
          uStack_5b6c = local_5b80;
          uStack_5b68 = local_5b80;
          uStack_5b64 = local_5b80;
          local_5e00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar65 = vblendvps_avx(local_5e00,(undefined1  [32])local_5ce0,local_5f60);
          *(undefined1 (*) [32])(ray + 0x100) = auVar65;
          local_5e60 = local_5f60;
          local_5f90.valid = (int *)local_5e60;
          local_5f90.geometryUserPtr = *(void **)((long)local_5e80 + 0x18);
          local_5f90.context = context->user;
          local_5f90.hit = (RTCHitN *)&local_5c80;
          local_5f90.N = 8;
          local_5f90.ray = (RTCRayN *)ray;
          if (*(code **)((long)local_5e80 + 0x48) != (code *)0x0) {
            (**(code **)((long)local_5e80 + 0x48))(&local_5f90);
          }
          auVar56 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
          auVar65 = _DAT_01f7b020 & ~auVar56;
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar65 >> 0x7f,0) == '\0') &&
                (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar65 >> 0xbf,0) == '\0') &&
              (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar65[0x1f]) {
            local_5f60._0_8_ = auVar56._0_8_ ^ 0xffffffffffffffff;
            local_5f60._8_4_ = auVar56._8_4_ ^ 0xffffffff;
            local_5f60._12_4_ = auVar56._12_4_ ^ 0xffffffff;
            local_5f60._16_4_ = auVar56._16_4_ ^ 0xffffffff;
            local_5f60._20_4_ = auVar56._20_4_ ^ 0xffffffff;
            local_5f60._24_4_ = auVar56._24_4_ ^ 0xffffffff;
            local_5f60._28_4_ = auVar56._28_4_ ^ 0xffffffff;
          }
          else {
            p_Var3 = context->args->filter;
            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)((long)local_5e80 + 0x3e) & 0x40) != 0)
                ))) {
              local_5f60 = local_5e60;
              (*p_Var3)(&local_5f90);
            }
            auVar65 = vpcmpeqd_avx2(local_5e60,_DAT_01f7b000);
            local_5f60 = auVar65 ^ _DAT_01f7b020;
            auVar59._8_4_ = 0xff800000;
            auVar59._0_8_ = 0xff800000ff800000;
            auVar59._12_4_ = 0xff800000;
            auVar59._16_4_ = 0xff800000;
            auVar59._20_4_ = 0xff800000;
            auVar59._24_4_ = 0xff800000;
            auVar59._28_4_ = 0xff800000;
            auVar65 = vblendvps_avx(auVar59,*(undefined1 (*) [32])(local_5f90.ray + 0x100),auVar65);
            *(undefined1 (*) [32])(local_5f90.ray + 0x100) = auVar65;
          }
          auVar65 = vblendvps_avx(local_5e00,*(undefined1 (*) [32])local_5f30,local_5f60);
          *(undefined1 (*) [32])local_5f30 = auVar65;
        }
        auVar56 = vandnps_avx(local_5f60,local_5f20);
        auVar65 = local_5f20 & ~local_5f60;
        auVar97 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        lVar43 = local_5ea0._0_8_;
        lVar45 = local_5ec0._0_8_;
        lVar47 = local_5f98;
        local_5f20 = auVar56;
        if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar65 >> 0x7f,0) == '\0') &&
              (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar65 >> 0xbf,0) == '\0') &&
            (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar65[0x1f]) break;
      }
      auVar56 = local_5f20;
    }
    auVar65 = local_5d80;
    auVar66 = ZEXT3264(local_5d80);
    auVar69 = vandps_avx(auVar56,local_5d80);
    lVar45 = lVar45 + 1;
    lVar42 = lVar42 + 0xe0;
    auVar56 = local_5d80 & auVar56;
    local_5d80 = auVar69;
  } while ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar56 >> 0x7f,0) != '\0') ||
             (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar56 >> 0xbf,0) != '\0') ||
           (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar56[0x1f] < '\0');
  auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
  auVar54._0_4_ = local_5d80._0_4_ ^ auVar65._0_4_;
  auVar54._4_4_ = local_5d80._4_4_ ^ auVar65._4_4_;
  auVar54._8_4_ = local_5d80._8_4_ ^ auVar65._8_4_;
  auVar54._12_4_ = local_5d80._12_4_ ^ auVar65._12_4_;
  auVar54._16_4_ = local_5d80._16_4_ ^ auVar65._16_4_;
  auVar54._20_4_ = local_5d80._20_4_ ^ auVar65._20_4_;
  auVar54._24_4_ = local_5d80._24_4_ ^ auVar65._24_4_;
  auVar54._28_4_ = local_5d80._28_4_ ^ auVar65._28_4_;
  local_5de0 = vorps_avx(auVar54,local_5de0);
  auVar65 = auVar65 & ~local_5de0;
  if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar65 >> 0x7f,0) == '\0') &&
        (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar65 >> 0xbf,0) == '\0') &&
      (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f])
  goto LAB_016a319c;
  auVar64._8_4_ = 0xff800000;
  auVar64._0_8_ = 0xff800000ff800000;
  auVar64._12_4_ = 0xff800000;
  auVar64._16_4_ = 0xff800000;
  auVar64._20_4_ = 0xff800000;
  auVar64._24_4_ = 0xff800000;
  auVar64._28_4_ = 0xff800000;
  auVar66 = ZEXT3264(auVar64);
  local_5840 = vblendvps_avx(local_5840,auVar64,local_5de0);
  goto LAB_016a20b1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }